

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::~QProcessPrivate(QProcessPrivate *this)

{
  QIODevicePrivate *in_RDI;
  unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
  *unaff_retaddr;
  
  (in_RDI->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QProcessPrivate_00bebc30;
  if (in_RDI[1].super_QObjectPrivate.super_QObjectData.children.d.d != (Data *)0x0) {
    Channel::clear((Channel *)in_RDI);
  }
  if (in_RDI[1].super_QObjectPrivate.extraData != (ExtraData *)0x0) {
    Channel::clear((Channel *)in_RDI);
  }
  std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>::
  ~unique_ptr(unaff_retaddr);
  QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)0x78f718);
  QString::~QString((QString *)0x78f729);
  QList<QString>::~QList((QList<QString> *)0x78f73a);
  QString::~QString((QString *)0x78f74b);
  Channel::~Channel((Channel *)0x78f75c);
  Channel::~Channel((Channel *)0x78f76d);
  Channel::~Channel((Channel *)0x78f77e);
  QIODevicePrivate::~QIODevicePrivate(in_RDI);
  return;
}

Assistant:

QProcessPrivate::~QProcessPrivate()
{
    if (stdinChannel.process)
        stdinChannel.process->stdoutChannel.clear();
    if (stdoutChannel.process)
        stdoutChannel.process->stdinChannel.clear();
}